

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutSeq.c
# Opt level: O3

void Cut_NodeComputeCutsSeq
               (Cut_Man_t *p,int Node,int Node0,int Node1,int fCompl0,int fCompl1,int nLat0,
               int nLat1,int fTriv,int CutSetNum)

{
  uint uVar1;
  int iVar2;
  Cut_Cut_t *pTemp_3;
  Cut_Cut_t *pCVar3;
  Cut_Cut_t **ppCVar4;
  Cut_Cut_t *pCVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  undefined1 auVar12 [16];
  long local_118;
  Cut_Cut_t *pHead;
  long local_108;
  Cut_List_t Super;
  
  pCVar3 = Cut_NodeReadCutsOld(p,Node);
  iVar2 = Cut_CutCountList(pCVar3);
  p->nNodeCuts = iVar2;
  if (iVar2 < p->pParams->nKeepMax) {
    if (iVar2 == 0) {
      p->nNodes = p->nNodes + 1;
    }
    pCVar3 = Cut_NodeReadCutsOld(p,Node0);
    p->pStore0[0] = pCVar3;
    pCVar3 = Cut_NodeReadCutsNew(p,Node0);
    p->pStore0[1] = pCVar3;
    pCVar3 = Cut_NodeReadCutsOld(p,Node1);
    p->pStore1[0] = pCVar3;
    pCVar3 = Cut_NodeReadCutsNew(p,Node1);
    p->pStore1[1] = pCVar3;
    if (Node0 == Node1 || (Node == Node1 || Node == Node0)) {
      pCVar3 = Cut_CutDupList(p,p->pStore0[0]);
      p->pStore0[0] = pCVar3;
      pCVar3 = Cut_CutDupList(p,p->pStore0[1]);
      p->pStore0[1] = pCVar3;
      pCVar3 = Cut_CutDupList(p,p->pStore1[0]);
      p->pStore1[0] = pCVar3;
      pCVar3 = Cut_CutDupList(p,p->pStore1[1]);
      p->pStore1[1] = pCVar3;
    }
    if (nLat0 != 0) {
      for (pCVar5 = p->pStore0[0]; pCVar5 != (Cut_Cut_t *)0x0; pCVar5 = pCVar5->pNext) {
        pCVar5->uSign = 0;
        uVar1 = *(uint *)pCVar5;
        if (0xfffffff < uVar1) {
          uVar7 = 0;
          uVar8 = 0;
          do {
            uVar9 = *(uint *)((long)&pCVar5[1].field_0x0 + uVar7 * 4) + nLat0;
            *(uint *)((long)&pCVar5[1].field_0x0 + uVar7 * 4) = uVar9;
            uVar8 = uVar8 | 1 << ((int)uVar9 % 0x1f & 0x1fU);
            uVar7 = uVar7 + 1;
          } while (uVar1 >> 0x1c != uVar7);
          pCVar5->uSign = uVar8;
        }
      }
      for (pCVar5 = p->pStore0[1]; pCVar5 != (Cut_Cut_t *)0x0; pCVar5 = pCVar5->pNext) {
        pCVar5->uSign = 0;
        uVar1 = *(uint *)pCVar5;
        if (0xfffffff < uVar1) {
          uVar7 = 0;
          uVar8 = 0;
          do {
            uVar9 = *(uint *)((long)&pCVar5[1].field_0x0 + uVar7 * 4) + nLat0;
            *(uint *)((long)&pCVar5[1].field_0x0 + uVar7 * 4) = uVar9;
            uVar8 = uVar8 | 1 << ((int)uVar9 % 0x1f & 0x1fU);
            uVar7 = uVar7 + 1;
          } while (uVar1 >> 0x1c != uVar7);
          pCVar5->uSign = uVar8;
        }
      }
    }
    if (nLat1 != 0) {
      for (pCVar5 = p->pStore1[0]; pCVar5 != (Cut_Cut_t *)0x0; pCVar5 = pCVar5->pNext) {
        pCVar5->uSign = 0;
        uVar1 = *(uint *)pCVar5;
        if (0xfffffff < uVar1) {
          uVar7 = 0;
          uVar8 = 0;
          do {
            uVar9 = *(uint *)((long)&pCVar5[1].field_0x0 + uVar7 * 4) + nLat1;
            *(uint *)((long)&pCVar5[1].field_0x0 + uVar7 * 4) = uVar9;
            uVar8 = uVar8 | 1 << ((int)uVar9 % 0x1f & 0x1fU);
            uVar7 = uVar7 + 1;
          } while (uVar1 >> 0x1c != uVar7);
          pCVar5->uSign = uVar8;
        }
      }
      for (; pCVar3 != (Cut_Cut_t *)0x0; pCVar3 = pCVar3->pNext) {
        pCVar3->uSign = 0;
        uVar1 = *(uint *)pCVar3;
        if (0xfffffff < uVar1) {
          uVar7 = 0;
          uVar8 = 0;
          do {
            uVar9 = *(uint *)((long)&pCVar3[1].field_0x0 + uVar7 * 4) + nLat1;
            *(uint *)((long)&pCVar3[1].field_0x0 + uVar7 * 4) = uVar9;
            uVar8 = uVar8 | 1 << ((int)uVar9 % 0x1f & 0x1fU);
            uVar7 = uVar7 + 1;
          } while (uVar1 >> 0x1c != uVar7);
          pCVar3->uSign = uVar8;
        }
      }
    }
    pCVar3 = Cut_NodeReadCutsOld(p,Node);
    p->pCompareOld = pCVar3;
    pCVar3 = Cut_NodeReadCutsNew(p,Node);
    p->pCompareNew = pCVar3;
    iVar2 = clock_gettime(3,(timespec *)&Super);
    if (iVar2 < 0) {
      local_118 = 1;
    }
    else {
      lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816((long)Super.pHead[1]),8);
      local_118 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + (long)Super.pHead[0] * -1000000;
    }
    Super.pHead[1] = (Cut_Cut_t *)0x0;
    Super.pHead[2] = (Cut_Cut_t *)0x0;
    Super.pHead[3] = (Cut_Cut_t *)0x0;
    Super.pHead[4] = (Cut_Cut_t *)0x0;
    Super.pHead[5] = (Cut_Cut_t *)0x0;
    Super.pHead[6] = (Cut_Cut_t *)0x0;
    Super.pHead[7] = (Cut_Cut_t *)0x0;
    Super.pHead[8] = (Cut_Cut_t *)0x0;
    Super.pHead[9] = (Cut_Cut_t *)0x0;
    Super.pHead[10] = (Cut_Cut_t *)0x0;
    Super.pHead[0xb] = (Cut_Cut_t *)0x0;
    Super.pHead[0xc] = (Cut_Cut_t *)0x0;
    lVar10 = 1;
    lVar11 = 2;
    lVar6 = 0xe;
    auVar12._8_4_ = (int)&Super;
    auVar12._0_8_ = &Super;
    auVar12._12_4_ = (int)((ulong)&Super >> 0x20);
    do {
      Super.pHead[lVar6] = (Cut_Cut_t *)(Super.pHead + lVar10);
      Super.pHead[lVar6 + 1] = (Cut_Cut_t *)(lVar11 * 8 + auVar12._8_8_);
      lVar10 = lVar10 + 2;
      lVar11 = lVar11 + 2;
      lVar6 = lVar6 + 2;
    } while (lVar6 != 0x1a);
    Cut_NodeDoComputeCuts(p,&Super,Node,fCompl0,fCompl1,p->pStore0[0],p->pStore1[1],0,0);
    Cut_NodeDoComputeCuts(p,&Super,Node,fCompl0,fCompl1,p->pStore0[1],p->pStore1[0],0,0);
    Cut_NodeDoComputeCuts(p,&Super,Node,fCompl0,fCompl1,p->pStore0[1],p->pStore1[1],fTriv,0);
    ppCVar4 = &pHead;
    pHead = (Cut_Cut_t *)0x0;
    lVar6 = -0x60;
    do {
      pCVar3 = *(Cut_Cut_t **)((long)Super.ppTail + lVar6);
      if (pCVar3 != (Cut_Cut_t *)0x0) {
        *ppCVar4 = pCVar3;
        ppCVar4 = *(Cut_Cut_t ***)(&stack0xffffffffffffffd0 + lVar6);
      }
      lVar6 = lVar6 + 8;
    } while (lVar6 != 0);
    *ppCVar4 = (Cut_Cut_t *)0x0;
    pCVar3 = pHead;
    iVar2 = clock_gettime(3,(timespec *)&pHead);
    if (iVar2 < 0) {
      lVar6 = -1;
    }
    else {
      lVar6 = local_108 / 1000 + (long)pHead * 1000000;
    }
    p->timeMerge = p->timeMerge + lVar6 + local_118;
    if (Node0 == Node1 || (Node == Node1 || Node == Node0)) {
      Cut_CutRecycleList(p,p->pStore0[0]);
      Cut_CutRecycleList(p,p->pStore0[1]);
      Cut_CutRecycleList(p,p->pStore1[0]);
      Cut_CutRecycleList(p,p->pStore1[1]);
    }
    else {
      if (nLat0 != 0) {
        for (pCVar5 = p->pStore0[0]; pCVar5 != (Cut_Cut_t *)0x0; pCVar5 = pCVar5->pNext) {
          pCVar5->uSign = 0;
          uVar1 = *(uint *)pCVar5;
          if (0xfffffff < uVar1) {
            uVar7 = 0;
            uVar8 = 0;
            do {
              uVar9 = *(uint *)((long)&pCVar5[1].field_0x0 + uVar7 * 4) - nLat0;
              *(uint *)((long)&pCVar5[1].field_0x0 + uVar7 * 4) = uVar9;
              uVar8 = uVar8 | 1 << ((int)uVar9 % 0x1f & 0x1fU);
              uVar7 = uVar7 + 1;
            } while (uVar1 >> 0x1c != uVar7);
            pCVar5->uSign = uVar8;
          }
        }
        for (pCVar5 = p->pStore0[1]; pCVar5 != (Cut_Cut_t *)0x0; pCVar5 = pCVar5->pNext) {
          pCVar5->uSign = 0;
          uVar1 = *(uint *)pCVar5;
          if (0xfffffff < uVar1) {
            uVar7 = 0;
            uVar8 = 0;
            do {
              uVar9 = *(uint *)((long)&pCVar5[1].field_0x0 + uVar7 * 4) - nLat0;
              *(uint *)((long)&pCVar5[1].field_0x0 + uVar7 * 4) = uVar9;
              uVar8 = uVar8 | 1 << ((int)uVar9 % 0x1f & 0x1fU);
              uVar7 = uVar7 + 1;
            } while (uVar1 >> 0x1c != uVar7);
            pCVar5->uSign = uVar8;
          }
        }
      }
      if (nLat1 != 0) {
        for (pCVar5 = p->pStore1[0]; pCVar5 != (Cut_Cut_t *)0x0; pCVar5 = pCVar5->pNext) {
          pCVar5->uSign = 0;
          uVar1 = *(uint *)pCVar5;
          if (0xfffffff < uVar1) {
            uVar7 = 0;
            uVar8 = 0;
            do {
              uVar9 = *(uint *)((long)&pCVar5[1].field_0x0 + uVar7 * 4) - nLat1;
              *(uint *)((long)&pCVar5[1].field_0x0 + uVar7 * 4) = uVar9;
              uVar8 = uVar8 | 1 << ((int)uVar9 % 0x1f & 0x1fU);
              uVar7 = uVar7 + 1;
            } while (uVar1 >> 0x1c != uVar7);
            pCVar5->uSign = uVar8;
          }
        }
        for (pCVar5 = p->pStore1[1]; pCVar5 != (Cut_Cut_t *)0x0; pCVar5 = pCVar5->pNext) {
          pCVar5->uSign = 0;
          uVar1 = *(uint *)pCVar5;
          if (0xfffffff < uVar1) {
            uVar7 = 0;
            uVar8 = 0;
            do {
              uVar9 = *(uint *)((long)&pCVar5[1].field_0x0 + uVar7 * 4) - nLat1;
              *(uint *)((long)&pCVar5[1].field_0x0 + uVar7 * 4) = uVar9;
              uVar8 = uVar8 | 1 << ((int)uVar9 % 0x1f & 0x1fU);
              uVar7 = uVar7 + 1;
            } while (uVar1 >> 0x1c != uVar7);
            pCVar5->uSign = uVar8;
          }
        }
      }
    }
    if (CutSetNum < 0) {
      pCVar5 = Cut_NodeReadCutsNew(p,Node);
      if (pCVar5 != (Cut_Cut_t *)0x0) {
        __assert_fail("Cut_NodeReadCutsNew(p, Node) == NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/cut/cutSeq.c"
                      ,0x91,
                      "void Cut_NodeComputeCutsSeq(Cut_Man_t *, int, int, int, int, int, int, int, int, int)"
                     );
      }
      Cut_NodeWriteCutsNew(p,Node,pCVar3);
    }
    else {
      pCVar5 = Cut_NodeReadCutsTemp(p,CutSetNum);
      if (pCVar5 != (Cut_Cut_t *)0x0) {
        __assert_fail("Cut_NodeReadCutsTemp(p, CutSetNum) == NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/cut/cutSeq.c"
                      ,0x8c,
                      "void Cut_NodeComputeCutsSeq(Cut_Man_t *, int, int, int, int, int, int, int, int, int)"
                     );
      }
      Cut_NodeWriteCutsTemp(p,CutSetNum,pCVar3);
    }
    if (p->pParams->nKeepMax <= p->nNodeCuts) {
      p->nCutsLimit = p->nCutsLimit + 1;
    }
  }
  return;
}

Assistant:

void Cut_NodeComputeCutsSeq( Cut_Man_t * p, int Node, int Node0, int Node1, int fCompl0, int fCompl1, int nLat0, int nLat1, int fTriv, int CutSetNum )
{
    Cut_List_t Super, * pSuper = &Super;
    Cut_Cut_t * pListNew;
    abctime clk;
    
    // get the number of cuts at the node
    p->nNodeCuts = Cut_CutCountList( Cut_NodeReadCutsOld(p, Node) );
    if ( p->nNodeCuts >= p->pParams->nKeepMax )
        return;

    // count only the first visit
    if ( p->nNodeCuts == 0 )
        p->nNodes++;

    // store the fanin lists
    p->pStore0[0] = Cut_NodeReadCutsOld( p, Node0 );
    p->pStore0[1] = Cut_NodeReadCutsNew( p, Node0 );
    p->pStore1[0] = Cut_NodeReadCutsOld( p, Node1 );
    p->pStore1[1] = Cut_NodeReadCutsNew( p, Node1 );

    // duplicate the cut lists if fanin nodes are non-standard
    if ( Node == Node0 || Node == Node1 || Node0 == Node1 )
    {
        p->pStore0[0] = Cut_CutDupList( p, p->pStore0[0] );
        p->pStore0[1] = Cut_CutDupList( p, p->pStore0[1] );
        p->pStore1[0] = Cut_CutDupList( p, p->pStore1[0] );
        p->pStore1[1] = Cut_CutDupList( p, p->pStore1[1] );
    }

    // shift the cuts by as many latches and recompute signatures
    if ( nLat0 ) Cut_NodeShiftCutLeaves( p->pStore0[0], nLat0 );
    if ( nLat0 ) Cut_NodeShiftCutLeaves( p->pStore0[1], nLat0 );
    if ( nLat1 ) Cut_NodeShiftCutLeaves( p->pStore1[0], nLat1 );
    if ( nLat1 ) Cut_NodeShiftCutLeaves( p->pStore1[1], nLat1 );

    // store the original lists for comparison
    p->pCompareOld = Cut_NodeReadCutsOld( p, Node );
    p->pCompareNew = Cut_NodeReadCutsNew( p, Node );

    // merge the old and the new
clk = Abc_Clock();
    Cut_ListStart( pSuper );
    Cut_NodeDoComputeCuts( p, pSuper, Node, fCompl0, fCompl1, p->pStore0[0], p->pStore1[1], 0, 0 );
    Cut_NodeDoComputeCuts( p, pSuper, Node, fCompl0, fCompl1, p->pStore0[1], p->pStore1[0], 0, 0 );
    Cut_NodeDoComputeCuts( p, pSuper, Node, fCompl0, fCompl1, p->pStore0[1], p->pStore1[1], fTriv, 0 );
    pListNew = Cut_ListFinish( pSuper );
p->timeMerge += Abc_Clock() - clk;

    // shift the cuts by as many latches and recompute signatures
    if ( Node == Node0 || Node == Node1 || Node0 == Node1 )
    {
        Cut_CutRecycleList( p, p->pStore0[0] );
        Cut_CutRecycleList( p, p->pStore0[1] );
        Cut_CutRecycleList( p, p->pStore1[0] );
        Cut_CutRecycleList( p, p->pStore1[1] );
    }
    else
    {
        if ( nLat0 ) Cut_NodeShiftCutLeaves( p->pStore0[0], -nLat0 );
        if ( nLat0 ) Cut_NodeShiftCutLeaves( p->pStore0[1], -nLat0 );
        if ( nLat1 ) Cut_NodeShiftCutLeaves( p->pStore1[0], -nLat1 );
        if ( nLat1 ) Cut_NodeShiftCutLeaves( p->pStore1[1], -nLat1 );
    }

    // set the lists at the node
    if ( CutSetNum >= 0 )
    {
        assert( Cut_NodeReadCutsTemp(p, CutSetNum) == NULL );
        Cut_NodeWriteCutsTemp( p, CutSetNum, pListNew );
    }
    else
    {
        assert( Cut_NodeReadCutsNew(p, Node) == NULL );
        Cut_NodeWriteCutsNew( p, Node, pListNew );
    }

    // mark the node if we exceeded the number of cuts
    if ( p->nNodeCuts >= p->pParams->nKeepMax )
        p->nCutsLimit++;
}